

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t type,wchar_t tag,wchar_t flags,
                   wchar_t *wname,wchar_t perm,wchar_t id)

{
  wchar_t *pwVar1;
  size_t sVar2;
  wchar_t wVar3;
  int local_34;
  wchar_t *pwStack_30;
  wchar_t i;
  wchar_t *wname_local;
  wchar_t flags_local;
  wchar_t tag_local;
  wchar_t type_local;
  wchar_t *prefix_local;
  wchar_t **wp_local;
  
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    sVar2 = wcslen(*wp);
    *wp = *wp + sVar2;
  }
  pwStack_30 = wname;
  if (tag != L'✑') {
    if (tag != L'✒') {
      if (tag != L'✓') {
        if (tag != L'✔') {
          if (tag == L'✕') {
            wcscpy(*wp,anon_var_dwarf_b27bc1);
            pwStack_30 = (wchar_t *)0x0;
            id = L'\xffffffff';
          }
          else if (tag == L'✖') {
            wcscpy(*wp,anon_var_dwarf_b27bcc);
            pwStack_30 = (wchar_t *)0x0;
            id = L'\xffffffff';
          }
          else if (tag == L'❻') {
            wcscpy(*wp,anon_var_dwarf_b27ab4);
            pwStack_30 = (wchar_t *)0x0;
            id = L'\xffffffff';
          }
          goto LAB_00aa98ad;
        }
        pwStack_30 = (wchar_t *)0x0;
        id = L'\xffffffff';
        if ((type & 0x3c00U) != 0) {
          wcscpy(*wp,anon_var_dwarf_b27aa9);
          goto LAB_00aa98ad;
        }
      }
      wcscpy(*wp,anon_var_dwarf_b27a87);
      goto LAB_00aa98ad;
    }
    pwStack_30 = (wchar_t *)0x0;
    id = L'\xffffffff';
    if ((type & 0x3c00U) != 0) {
      wcscpy(*wp,anon_var_dwarf_b27a9e);
      goto LAB_00aa98ad;
    }
  }
  wcscpy(*wp,anon_var_dwarf_b27a7c);
LAB_00aa98ad:
  sVar2 = wcslen(*wp);
  *wp = *wp + sVar2;
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = L':';
  if ((((type & 0x300U) != 0) || (tag == L'✑')) || (tag == L'✓')) {
    if (pwStack_30 == (wchar_t *)0x0) {
      if (((tag == L'✑') || (tag == L'✓')) && (append_id_w(wp,id), (type & 0x3c00U) == 0)) {
        id = L'\xffffffff';
      }
    }
    else {
      wcscpy(*wp,pwStack_30);
      sVar2 = wcslen(*wp);
      *wp = *wp + sVar2;
    }
    if (((flags & 4U) == 0) || ((tag != L'✖' && (tag != L'✕')))) {
      pwVar1 = *wp;
      *wp = pwVar1 + 1;
      *pwVar1 = L':';
    }
  }
  if ((type & 0x300U) == 0) {
    for (local_34 = 0; local_34 < 0xe; local_34 = local_34 + 1) {
      if ((perm & nfsv4_acl_perm_map[local_34].perm) == 0) {
        if ((flags & 0x10U) == 0) {
          pwVar1 = *wp;
          *wp = pwVar1 + 1;
          *pwVar1 = L'-';
        }
      }
      else {
        wVar3 = nfsv4_acl_perm_map[local_34].wc;
        pwVar1 = *wp;
        *wp = pwVar1 + 1;
        *pwVar1 = wVar3;
      }
    }
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = L':';
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      if ((perm & nfsv4_acl_flag_map[local_34].perm) == 0) {
        if ((flags & 0x10U) == 0) {
          pwVar1 = *wp;
          *wp = pwVar1 + 1;
          *pwVar1 = L'-';
        }
      }
      else {
        wVar3 = nfsv4_acl_flag_map[local_34].wc;
        pwVar1 = *wp;
        *wp = pwVar1 + 1;
        *pwVar1 = wVar3;
      }
    }
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = L':';
    if (type == L'Ѐ') {
      wcscpy(*wp,anon_var_dwarf_b27ad6);
    }
    else if (type == L'ࠀ') {
      wcscpy(*wp,anon_var_dwarf_b27acb);
    }
    else if (type == L'က') {
      wcscpy(*wp,anon_var_dwarf_b27ae1);
    }
    else if (type == L'\x2000') {
      wcscpy(*wp,anon_var_dwarf_b27aec);
    }
    sVar2 = wcslen(*wp);
    *wp = *wp + sVar2;
  }
  else {
    wVar3 = L'-';
    if ((perm & 0x124U) != 0) {
      wVar3 = L'r';
    }
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = wVar3;
    wVar3 = L'-';
    if ((perm & 0x92U) != 0) {
      wVar3 = L'w';
    }
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = wVar3;
    wVar3 = L'-';
    if ((perm & 0x49U) != 0) {
      wVar3 = L'x';
    }
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = wVar3;
  }
  if (id != L'\xffffffff') {
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = L':';
    append_id_w(wp,id);
  }
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int type,
    int tag, int flags, const wchar_t *wname, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		wcscpy(*wp, L"everyone@");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (wname != NULL) {
			wcscpy(*wp, wname);
			*wp += wcslen(*wp);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id_w(wp, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*wp)++ = L':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*wp)++ = (perm & 0444) ? L'r' : L'-';
		*(*wp)++ = (perm & 0222) ? L'w' : L'-';
		*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*wp)++ = nfsv4_acl_perm_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*wp)++ = nfsv4_acl_flag_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			wcscpy(*wp, L"allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			wcscpy(*wp, L"deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			wcscpy(*wp, L"audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			wcscpy(*wp, L"alarm");
			break;
		default:
			break;
		}
		*wp += wcslen(*wp);
	}
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
}